

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::shiftFvec(SPxSolverBase<double> *this)

{
  double *pdVar1;
  SPxSolverBase<double> *in_RDI;
  double dVar2;
  int i;
  double allow;
  double maxrandom;
  double minrandom;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  VectorBase<double> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  Random *in_stack_ffffffffffffff60;
  int i_00;
  SPxSolverBase<double> *in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  double local_38;
  double local_30;
  int local_24;
  double local_20;
  double local_18;
  double local_10;
  
  local_10 = entertol((SPxSolverBase<double> *)
                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  local_10 = local_10 * 10.0;
  local_18 = entertol((SPxSolverBase<double> *)
                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  local_18 = local_18 * 100.0;
  dVar2 = entertol((SPxSolverBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  local_20 = epsilon((SPxSolverBase<double> *)0x280575);
  local_20 = dVar2 - local_20;
  local_24 = dim((SPxSolverBase<double> *)0x280595);
  while (local_24 = local_24 + -1, -1 < local_24) {
    pdVar1 = VectorBase<double>::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    dVar2 = *pdVar1 + local_20;
    pdVar1 = VectorBase<double>::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    if (*pdVar1 <= dVar2) {
      pdVar1 = VectorBase<double>::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      in_stack_ffffffffffffff78 = *pdVar1;
      pdVar1 = VectorBase<double>::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      if (in_stack_ffffffffffffff78 < *pdVar1 - local_20) {
        pdVar1 = VectorBase<double>::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c)
        ;
        dVar2 = *pdVar1;
        pdVar1 = VectorBase<double>::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c)
        ;
        local_38 = (dVar2 - *pdVar1) - local_20;
        SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[39],_int_&,_double,_0>
                  (in_RDI,(char (*) [39])"DSHIFT08 theLBbound[{}] violated by {}",&local_24,
                   &local_38);
        i_00 = (int)((ulong)dVar2 >> 0x20);
        pdVar1 = VectorBase<double>::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c)
        ;
        in_stack_ffffffffffffff70 = (SPxSolverBase<double> *)*pdVar1;
        pdVar1 = VectorBase<double>::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c)
        ;
        if (((double)in_stack_ffffffffffffff70 != *pdVar1) ||
           (NAN((double)in_stack_ffffffffffffff70) || NAN(*pdVar1))) {
          in_stack_ffffffffffffff5c = local_24;
          pdVar1 = VectorBase<double>::operator[]
                             (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
          in_stack_ffffffffffffff60 = (Random *)*pdVar1;
          Random::next(in_stack_ffffffffffffff60,
                       (Real)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                       (Real)in_stack_ffffffffffffff50);
          shiftLBbound(in_stack_ffffffffffffff70,i_00,(double)in_stack_ffffffffffffff60);
        }
        else {
          in_stack_ffffffffffffff4c = local_24;
          VectorBase<double>::operator[](in_stack_ffffffffffffff50,local_24);
          shiftLBbound(in_stack_ffffffffffffff70,i_00,(double)in_stack_ffffffffffffff60);
          pdVar1 = VectorBase<double>::operator[]
                             (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
          in_stack_ffffffffffffff50 = (VectorBase<double> *)*pdVar1;
          pdVar1 = VectorBase<double>::operator[]
                             (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
          *pdVar1 = (double)in_stack_ffffffffffffff50;
        }
      }
    }
    else {
      pdVar1 = VectorBase<double>::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      dVar2 = *pdVar1;
      pdVar1 = VectorBase<double>::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      local_30 = (dVar2 - *pdVar1) - local_20;
      SPxOut::debug<soplex::SPxSolverBase<double>,_const_char_(&)[39],_int_&,_double,_0>
                (in_RDI,(char (*) [39])"DSHIFT08 theUBbound[{}] violated by {}",&local_24,&local_30)
      ;
      pdVar1 = VectorBase<double>::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      dVar2 = *pdVar1;
      pdVar1 = VectorBase<double>::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
        VectorBase<double>::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        Random::next(in_stack_ffffffffffffff60,
                     (Real)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (Real)in_stack_ffffffffffffff50);
        shiftUBbound((SPxSolverBase<double> *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                     (double)in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff84 = local_24;
        VectorBase<double>::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        shiftUBbound((SPxSolverBase<double> *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                     (double)in_stack_ffffffffffffff70);
        pdVar1 = VectorBase<double>::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c)
        ;
        dVar2 = *pdVar1;
        pdVar1 = VectorBase<double>::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c)
        ;
        *pdVar1 = dVar2;
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::shiftFvec()
{

   /* the allowed tolerance is (rep() == COLUMN) ? tolerances()->floatingPointFeastol() : tolerances()->floatingPointOpttol() because theFvec is the primal VectorBase<R> in COLUMN
    * and the dual VectorBase<R> in ROW representation; this is equivalent to entertol()
    */
   R minrandom = 10.0 * entertol();
   R maxrandom = 100.0 * entertol();
   R allow = entertol() - epsilon();

   assert(type() == ENTER);
   assert(allow > 0);

   for(int i = dim() - 1; i >= 0; --i)
   {
      if(theUBbound[i] + allow < (*theFvec)[i])
      {
         SPxOut::debug(this, "DSHIFT08 theUBbound[{}] violated by {}", i,
                       (*theFvec)[i] - theUBbound[i] - allow);

         if(theUBbound[i] != theLBbound[i])
         {
            // since minrandom and maxrandom are of the order 10 different,
            // we currently doesn't care about higher precision random
            // numbers. Hence the cast to double.
            shiftUBbound(i, (*theFvec)[i] + random.next((double)minrandom, (double)maxrandom));
         }
         else
         {
            shiftUBbound(i, (*theFvec)[i]);
            theLBbound[i] = theUBbound[i];
         }
      }
      else if((*theFvec)[i] < theLBbound[i] - allow)
      {
         SPxOut::debug(this, "DSHIFT08 theLBbound[{}] violated by {}", i,
                       theLBbound[i] - (*theFvec)[i] - allow);

         if(theUBbound[i] != theLBbound[i])
            shiftLBbound(i, (*theFvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLBbound(i, (*theFvec)[i]);
            theUBbound[i] = theLBbound[i];
         }
      }
   }

#ifndef NDEBUG
   testBounds();
   SPxOut::debug(this, "DSHIFT01 shiftFvec: OK\n");
#endif
}